

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.cpp
# Opt level: O0

ostream * wasm::operator<<(ostream *o,Literal *literal)

{
  IteratorBase<wasm::SmallVector<wasm::Literal,_1UL>,_wasm::SmallVector<wasm::Literal,_1UL>::Iterator>
  IVar1;
  bool bVar2;
  BasicType BVar3;
  BasicHeapType BVar4;
  int32_t iVar5;
  int64_t iVar6;
  value_type *other;
  ostream *poVar7;
  element_type *peVar8;
  SmallVector<wasm::Literal,_1UL> *pSVar9;
  float f;
  double d;
  array<unsigned_char,_16UL> aVar10;
  Iterator IVar11;
  IteratorBase<wasm::SmallVector<wasm::Literal,_1UL>,_wasm::SmallVector<wasm::Literal,_1UL>::Iterator>
  IVar12;
  Name NVar13;
  string_view str;
  Name name;
  size_t local_380;
  Literals local_2b8;
  uintptr_t local_280;
  shared_ptr<wasm::GCData> data_1;
  string local_258 [32];
  undefined1 local_238 [16];
  undefined8 local_228;
  int64_t u;
  value_type c;
  Iterator __end6;
  Iterator __begin6;
  Literals *__range6;
  stringstream wtf16;
  ostream local_1d0 [376];
  shared_ptr<wasm::GCData> data;
  HeapType heapType;
  PrintLimiter local_19;
  Literal *pLStack_18;
  PrintLimiter limiter;
  Literal *literal_local;
  ostream *o_local;
  
  pLStack_18 = literal;
  anon_unknown_0::PrintLimiter::PrintLimiter(&local_19);
  prepareMinorColor(o);
  bVar2 = Type::isSingle(&literal->type);
  if (!bVar2) {
    __assert_fail("literal.type.isSingle()",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/literal.cpp"
                  ,0x25e,"std::ostream &wasm::operator<<(std::ostream &, Literal)");
  }
  bVar2 = Type::isBasic(&literal->type);
  if (bVar2) {
    BVar3 = Type::getBasic(&literal->type);
    switch(BVar3) {
    case none:
      std::operator<<(o,"?");
      break;
    case unreachable:
      handle_unreachable("unexpected type",
                         "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/literal.cpp"
                         ,0x275);
    case i32:
      iVar5 = Literal::geti32(literal);
      std::ostream::operator<<(o,iVar5);
      break;
    case i64:
      iVar6 = Literal::geti64(literal);
      std::ostream::operator<<(o,iVar6);
      break;
    case f32:
      f = Literal::getf32(literal);
      Literal::printFloat(o,f);
      break;
    case f64:
      d = Literal::getf64(literal);
      Literal::printDouble(o,d);
      break;
    case v128:
      std::operator<<(o,"i32x4 ");
      aVar10 = Literal::getv128(literal);
      register0x00000000 = aVar10._M_elems._0_8_;
      Literal::printVec128(o,(array<unsigned_char,_16UL> *)((long)&heapType.id + 4));
    }
  }
  else {
    bVar2 = Type::isRef(&literal->type);
    if (!bVar2) {
      __assert_fail("literal.type.isRef()",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/literal.cpp"
                    ,0x278,"std::ostream &wasm::operator<<(std::ostream &, Literal)");
    }
    data.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)Type::getHeapType(&literal->type);
    bVar2 = HeapType::isShared((HeapType *)
                               &data.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>.
                                _M_refcount);
    if (bVar2) {
      std::operator<<(o,"shared ");
    }
    bVar2 = HeapType::isBasic((HeapType *)
                              &data.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>.
                               _M_refcount);
    if (bVar2) {
      BVar4 = HeapType::getBasic((HeapType *)
                                 &data.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>.
                                  _M_refcount,Unshared);
      switch(BVar4) {
      case ext:
        std::operator<<(o,"externref");
        break;
      case func:
      case cont:
      case eq:
      case struct_:
      case array:
        handle_unreachable("invalid type",
                           "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/literal.cpp"
                           ,0x29c);
      case any:
      case string:
        Literal::getGCData((Literal *)&stack0xffffffffffffffa8);
        bVar2 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&stack0xffffffffffffffa8);
        if (bVar2) {
          std::operator<<(o,"string(");
          std::__cxx11::stringstream::stringstream((stringstream *)&__range6);
          peVar8 = std::__shared_ptr_access<wasm::GCData,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<wasm::GCData,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)&stack0xffffffffffffffa8);
          IVar11 = SmallVector<wasm::Literal,_1UL>::begin
                             (&(peVar8->values).super_SmallVector<wasm::Literal,_1UL>);
          __end6.
          super_IteratorBase<wasm::SmallVector<wasm::Literal,_1UL>,_wasm::SmallVector<wasm::Literal,_1UL>::Iterator>
          .index = (size_t)IVar11.
                           super_IteratorBase<wasm::SmallVector<wasm::Literal,_1UL>,_wasm::SmallVector<wasm::Literal,_1UL>::Iterator>
                           .parent;
          IVar12 = (IteratorBase<wasm::SmallVector<wasm::Literal,_1UL>,_wasm::SmallVector<wasm::Literal,_1UL>::Iterator>
                    )SmallVector<wasm::Literal,_1UL>::end
                               (&(peVar8->values).super_SmallVector<wasm::Literal,_1UL>);
          IVar1 = IVar12;
          while( true ) {
            __end6.
            super_IteratorBase<wasm::SmallVector<wasm::Literal,_1UL>,_wasm::SmallVector<wasm::Literal,_1UL>::Iterator>
            .parent = (SmallVector<wasm::Literal,_1UL> *)IVar1.index;
            c.type.id = (uintptr_t)IVar1.parent;
            local_380 = IVar12.index;
            pSVar9 = IVar12.parent;
            bVar2 = SmallVector<wasm::Literal,_1UL>::
                    IteratorBase<wasm::SmallVector<wasm::Literal,_1UL>,_wasm::SmallVector<wasm::Literal,_1UL>::Iterator>
                    ::operator!=((IteratorBase<wasm::SmallVector<wasm::Literal,_1UL>,_wasm::SmallVector<wasm::Literal,_1UL>::Iterator>
                                  *)&__end6.
                                     super_IteratorBase<wasm::SmallVector<wasm::Literal,_1UL>,_wasm::SmallVector<wasm::Literal,_1UL>::Iterator>
                                     .index,(Iterator *)&c.type);
            if (!bVar2) break;
            other = SmallVector<wasm::Literal,_1UL>::Iterator::operator*
                              ((Iterator *)
                               &__end6.
                                super_IteratorBase<wasm::SmallVector<wasm::Literal,_1UL>,_wasm::SmallVector<wasm::Literal,_1UL>::Iterator>
                                .index);
            Literal::Literal((Literal *)&u,other);
            local_228 = Literal::getInteger((Literal *)&u);
            if (0xffff < local_228) {
              __assert_fail("u < 0x10000",
                            "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/literal.cpp"
                            ,0x2a9,"std::ostream &wasm::operator<<(std::ostream &, Literal)");
            }
            std::operator<<(local_1d0,(uchar)local_228);
            std::operator<<(local_1d0,local_228._1_1_);
            Literal::~Literal((Literal *)&u);
            SmallVector<wasm::Literal,_1UL>::
            IteratorBase<wasm::SmallVector<wasm::Literal,_1UL>,_wasm::SmallVector<wasm::Literal,_1UL>::Iterator>
            ::operator++((IteratorBase<wasm::SmallVector<wasm::Literal,_1UL>,_wasm::SmallVector<wasm::Literal,_1UL>::Iterator>
                          *)&__end6.
                             super_IteratorBase<wasm::SmallVector<wasm::Literal,_1UL>,_wasm::SmallVector<wasm::Literal,_1UL>::Iterator>
                             .index);
            IVar1.index = (size_t)__end6.
                                  super_IteratorBase<wasm::SmallVector<wasm::Literal,_1UL>,_wasm::SmallVector<wasm::Literal,_1UL>::Iterator>
                                  .parent;
            IVar1.parent = (SmallVector<wasm::Literal,_1UL> *)c.type.id;
            IVar12.index = local_380;
            IVar12.parent = pSVar9;
          }
          std::__cxx11::stringstream::str();
          local_238 = std::__cxx11::string::operator_cast_to_basic_string_view(local_258);
          str._M_len = local_238._8_8_;
          str._M_str = (char *)pSVar9;
          String::printEscapedJSON((String *)o,local_238._0_8_,str);
          std::__cxx11::string::~string(local_258);
          std::operator<<(o,")");
          std::__cxx11::stringstream::~stringstream((stringstream *)&__range6);
        }
        else {
          std::operator<<(o,"nullstring");
        }
        std::shared_ptr<wasm::GCData>::~shared_ptr
                  ((shared_ptr<wasm::GCData> *)&stack0xffffffffffffffa8);
        break;
      case i31:
        poVar7 = std::operator<<(o,"i31ref(");
        iVar5 = Literal::geti31(literal,true);
        poVar7 = (ostream *)std::ostream::operator<<(poVar7,iVar5);
        std::operator<<(poVar7,")");
        break;
      case exn:
        std::operator<<(o,"exnref");
        break;
      case none:
        std::operator<<(o,"nullref");
        break;
      case noext:
        std::operator<<(o,"nullexternref");
        break;
      case nofunc:
        std::operator<<(o,"nullfuncref");
        break;
      case nocont:
        std::operator<<(o,"nullcontref");
        break;
      case noexn:
        std::operator<<(o,"nullexnref");
      }
    }
    else {
      bVar2 = HeapType::isSignature
                        ((HeapType *)
                         &data.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount);
      if (bVar2) {
        poVar7 = std::operator<<(o,"funcref(");
        NVar13 = Literal::getFunc(literal);
        name.super_IString.str._M_len = NVar13.super_IString.str._M_str;
        data_1.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             NVar13.super_IString.str._M_len;
        name.super_IString.str._M_str =
             (char *)data_1.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                     ._M_pi;
        poVar7 = operator<<((wasm *)poVar7,
                            (ostream *)
                            data_1.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount._M_pi,name);
        std::operator<<(poVar7,")");
      }
      else {
        bVar2 = Literal::isData(literal);
        if (!bVar2) {
          __assert_fail("literal.isData()",
                        "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/literal.cpp"
                        ,0x2b9,"std::ostream &wasm::operator<<(std::ostream &, Literal)");
        }
        Literal::getGCData((Literal *)&stack0xfffffffffffffd88);
        bVar2 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&stack0xfffffffffffffd88);
        if (!bVar2) {
          __assert_fail("data",
                        "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/literal.cpp"
                        ,699,"std::ostream &wasm::operator<<(std::ostream &, Literal)");
        }
        poVar7 = std::operator<<(o,"[ref ");
        peVar8 = std::__shared_ptr_access<wasm::GCData,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<wasm::GCData,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&stack0xfffffffffffffd88);
        local_280 = (peVar8->type).id;
        poVar7 = operator<<(poVar7,(HeapType)local_280);
        poVar7 = std::operator<<(poVar7,' ');
        peVar8 = std::__shared_ptr_access<wasm::GCData,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<wasm::GCData,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&stack0xfffffffffffffd88);
        Literals::Literals(&local_2b8,&peVar8->values);
        poVar7 = operator<<(poVar7,&local_2b8);
        std::operator<<(poVar7,']');
        Literals::~Literals(&local_2b8);
        std::shared_ptr<wasm::GCData>::~shared_ptr
                  ((shared_ptr<wasm::GCData> *)&stack0xfffffffffffffd88);
      }
    }
  }
  restoreNormalColor(o);
  anon_unknown_0::PrintLimiter::~PrintLimiter(&local_19);
  return o;
}

Assistant:

std::ostream& operator<<(std::ostream& o, Literal literal) {
  PrintLimiter limiter;

  prepareMinorColor(o);
  assert(literal.type.isSingle());
  if (literal.type.isBasic()) {
    switch (literal.type.getBasic()) {
      case Type::none:
        o << "?";
        break;
      case Type::i32:
        o << literal.geti32();
        break;
      case Type::i64:
        o << literal.geti64();
        break;
      case Type::f32:
        literal.printFloat(o, literal.getf32());
        break;
      case Type::f64:
        literal.printDouble(o, literal.getf64());
        break;
      case Type::v128:
        o << "i32x4 ";
        literal.printVec128(o, literal.getv128());
        break;
      case Type::unreachable:
        WASM_UNREACHABLE("unexpected type");
    }
  } else {
    assert(literal.type.isRef());
    auto heapType = literal.type.getHeapType();
    if (heapType.isShared()) {
      o << "shared ";
    }
    if (heapType.isBasic()) {
      switch (heapType.getBasic(Unshared)) {
        case HeapType::i31:
          o << "i31ref(" << literal.geti31() << ")";
          break;
        case HeapType::none:
          o << "nullref";
          break;
        case HeapType::noext:
          o << "nullexternref";
          break;
        case HeapType::nofunc:
          o << "nullfuncref";
          break;
        case HeapType::noexn:
          o << "nullexnref";
          break;
        case HeapType::nocont:
          o << "nullcontref";
          break;
        case HeapType::ext:
          o << "externref";
          break;
        case HeapType::exn:
          o << "exnref";
          break;
        case HeapType::eq:
        case HeapType::func:
        case HeapType::cont:
        case HeapType::struct_:
        case HeapType::array:
          WASM_UNREACHABLE("invalid type");
        case HeapType::any:
          // Anyref literals contain strings.
        case HeapType::string: {
          auto data = literal.getGCData();
          if (!data) {
            o << "nullstring";
          } else {
            o << "string(";
            // Convert WTF-16 literals to WTF-16 string.
            std::stringstream wtf16;
            for (auto c : data->values) {
              auto u = c.getInteger();
              assert(u < 0x10000);
              wtf16 << uint8_t(u & 0xFF);
              wtf16 << uint8_t(u >> 8);
            }
            // Escape to ensure we have valid unicode output and to make
            // unprintable characters visible.
            // TODO: Use wtf16.view() once we have C++20.
            String::printEscapedJSON(o, wtf16.str());
            o << ")";
          }
          break;
        }
      }
    } else if (heapType.isSignature()) {
      o << "funcref(" << literal.getFunc() << ")";
    } else {
      assert(literal.isData());
      auto data = literal.getGCData();
      assert(data);
      o << "[ref " << data->type << ' ' << data->values << ']';
    }
  }
  restoreNormalColor(o);
  return o;
}